

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

void __thiscall Dice::rollDice(Dice *this)

{
  int iVar1;
  mapped_type *pmVar2;
  int iVar3;
  DiceOptions value;
  key_type local_54;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_50;
  
  iVar3 = 6;
  do {
    iVar1 = rand();
    local_54 = iVar1 % 6;
    pmVar2 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](&this->DiceValues,&local_54);
    *pmVar2 = *pmVar2 + 1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  resolveDuringHand(this);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::_Rb_tree(&local_50,&(this->DiceValues)._M_t);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::push_back(&this->historyOfRolls,(value_type *)&local_50);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~_Rb_tree(&local_50);
  resetDiceValuesMap(this);
  this->numberOfRolls = this->numberOfRolls + -1;
  return;
}

Assistant:

void Dice::rollDice(){
    DiceOptions value;
    for(int i=0; i<6; i++)
    {
        value = randomDiceOption();
        this->DiceValues[value] ++;
    }

    resolveDuringHand();

    storeDiceResult(DiceValues);
    resetDiceValuesMap();
    this->numberOfRolls--;
}